

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O0

void __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,float>::
read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
          (Flag_complex_edge_collapser<int,float> *this,
          vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_> *r)

{
  unsigned_long uVar1;
  pointer this_00;
  bool bVar2;
  float *pfVar3;
  __tuple_element_t<1UL,_tuple<int,_int,_float>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<int,_int,_float>_> *p_Var5;
  size_type sVar6;
  vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void> *pvVar7;
  reference this_01;
  reference seq;
  float local_84;
  unsigned_long local_80;
  size_t i;
  __tuple_element_t<1UL,_tuple<int,_int,_float>_> local_70;
  float f;
  int v;
  int u;
  tuple<int,_int,_float> *e;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_> *__range3;
  allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>
  local_31;
  undefined1 local_30 [8];
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  neighbors_seq;
  vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_> *r_local;
  Flag_complex_edge_collapser<int,_float> *this_local;
  
  neighbors_seq.
  super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)r;
  std::
  vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
  ::resize((vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
            *)this,*(size_type *)(this + 0x18));
  sVar6 = *(size_type *)(this + 0x18);
  std::
  allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>
  ::allocator(&local_31);
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::vector((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
            *)local_30,sVar6,&local_31);
  std::
  allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>
  ::~allocator(&local_31);
  this_00 = neighbors_seq.
            super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end0 = std::vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>::
           begin((vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
                  *)neighbors_seq.
                    super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  e = (tuple<int,_int,_float> *)
      std::vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>::end
                ((vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
                  *)this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::tuple<int,_int,_float>_*,_std::vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>_>
                                *)&e);
    if (!bVar2) break;
    _v = __gnu_cxx::
         __normal_iterator<const_std::tuple<int,_int,_float>_*,_std::vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>_>
         ::operator*(&__end0);
    pfVar3 = (float *)std::get<0ul,int,int,float>(_v);
    f = *pfVar3;
    p_Var4 = std::get<1ul,int,int,float>(_v);
    local_70 = *p_Var4;
    p_Var5 = std::get<2ul,int,int,float>(_v);
    i._4_4_ = *p_Var5;
    pvVar7 = (vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
              *)std::
                vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                ::operator[]((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                              *)local_30,(long)(int)f);
    boost::container::
    vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
    emplace_back<int&,float&>(pvVar7,&local_70,(float *)((long)&i + 4));
    pvVar7 = (vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
              *)std::
                vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                ::operator[]((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                              *)local_30,(long)local_70);
    boost::container::
    vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
    emplace_back<int&,float&>(pvVar7,(int *)&f,(float *)((long)&i + 4));
    __gnu_cxx::
    __normal_iterator<const_std::tuple<int,_int,_float>_*,_std::vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>_>
    ::operator++(&__end0);
  }
  local_80 = 0;
  while( true ) {
    uVar1 = local_80;
    sVar6 = std::
            vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
            ::size((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                    *)local_30);
    if (sVar6 <= uVar1) break;
    pvVar7 = (vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
              *)std::
                vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                ::operator[]((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                              *)local_30,local_80);
    local_84 = std::numeric_limits<float>::infinity();
    local_84 = -local_84;
    boost::container::
    vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
    emplace_back<unsigned_long&,float>(pvVar7,&local_80,&local_84);
    this_01 = std::
              vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
              ::operator[]((vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
                            *)this,local_80);
    seq = std::
          vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
          ::operator[]((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                        *)local_30,local_80);
    boost::container::flat_map<int,_float,_std::less<int>,_void>::adopt_sequence(this_01,seq);
    local_80 = local_80 + 1;
  }
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::~vector((vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
             *)local_30);
  return;
}

Assistant:

void read_edges(FilteredEdgeRange const&r){
    neighbors.resize(num_vertices);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    init_neighbors_dense();
#endif
    // Use the raw sequence to avoid maintaining the order
    std::vector<typename Ngb_list::sequence_type> neighbors_seq(num_vertices);
    for(auto&&e : r){
      using std::get;
      Vertex u = get<0>(e);
      Vertex v = get<1>(e);
      Filtration_value f = get<2>(e);
      neighbors_seq[u].emplace_back(v, f);
      neighbors_seq[v].emplace_back(u, f);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(u,v)=f;
      neighbors_dense(v,u)=f;
#endif
    }
    for(std::size_t i=0;i<neighbors_seq.size();++i){
      neighbors_seq[i].emplace_back(i, -std::numeric_limits<Filtration_value>::infinity());
      neighbors[i].adopt_sequence(std::move(neighbors_seq[i])); // calls sort
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(i,i)=-std::numeric_limits<Filtration_value>::infinity();
#endif
    }
  }